

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigPhase.c
# Opt level: O3

int Saig_TsiComputePrefix(Saig_Tsim_t *p,uint *pState,int nWords)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  uint *__s1;
  long lVar5;
  
  if (nWords < 1) {
    uVar1 = 0;
  }
  else {
    uVar4 = 0;
    uVar1 = 0;
    do {
      uVar1 = uVar1 ^ Saig_TsiStateHash::s_FPrimes[(uint)uVar4 & 0x7f] * pState[uVar4];
      uVar4 = uVar4 + 1;
    } while ((uint)nWords != uVar4);
  }
  __s1 = p->pBins[(int)(uVar1 % (uint)p->nBins)];
  lVar5 = 0xffffffff;
  if (__s1 != (uint *)0x0) {
    while (iVar2 = bcmp(__s1,pState,(long)nWords * 4), iVar2 != 0) {
      __s1 = *(uint **)(__s1 + nWords);
      if (__s1 == (uint *)0x0) goto LAB_006364d6;
    }
    lVar3 = (long)p->vStates->nSize;
    if (lVar3 < 1) goto LAB_0063650a;
    lVar5 = 0;
    while ((uint *)p->vStates->pArray[lVar5] != __s1) {
      lVar5 = lVar5 + 1;
      if (lVar3 == lVar5) {
LAB_0063650a:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigPhase.c"
                      ,0x17a,"int Saig_TsiComputePrefix(Saig_Tsim_t *, unsigned int *, int)");
      }
    }
  }
LAB_006364d6:
  return (int)lVar5;
}

Assistant:

int Saig_TsiComputePrefix( Saig_Tsim_t * p, unsigned * pState, int nWords )
{
    unsigned * pEntry, * pPrev;
    int Hash, i;
    Hash = Saig_TsiStateHash( pState, nWords, p->nBins );
    for ( pEntry = p->pBins[Hash]; pEntry; pEntry = Saig_TsiNext(pEntry, nWords) )
        if ( !memcmp( pEntry, pState, sizeof(unsigned) * nWords ) )
        {
            Vec_PtrForEachEntry( unsigned *, p->vStates, pPrev, i )
            {
                if ( pPrev == pEntry )
                    return i;
            }
            assert( 0 );
            return -1;
        }
    return -1;
}